

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testFutureProofing.cpp
# Opt level: O2

bool anon_unknown.dwarf_183ce9::checkPixels<float>
               (Array2D<unsigned_int> *sampleCount,Array2D<float_*> *ph,int lx,int rx,int ly,int ry,
               int width)

{
  long lVar1;
  ostream *poVar2;
  int iVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  float fVar7;
  
  lVar5 = (long)ly;
  do {
    if (ry < lVar5) {
LAB_00160182:
      return ry < lVar5;
    }
    for (lVar6 = (long)lx; lVar6 <= rx; lVar6 = lVar6 + 1) {
      iVar3 = ((int)lVar6 + (int)lVar5 * width) % 0x801;
      fVar7 = (float)iVar3;
      lVar4 = -1;
      while (lVar4 - (ulong)sampleCount->_data[sampleCount->_sizeY * lVar5 + lVar6] != -1) {
        lVar1 = lVar4 + 1;
        lVar4 = lVar4 + 1;
        if ((ph->_data[ph->_sizeY * lVar5 + lVar6][lVar1] != fVar7) ||
           (NAN(ph->_data[ph->_sizeY * lVar5 + lVar6][lVar1]) || NAN(fVar7))) {
          poVar2 = std::operator<<((ostream *)&std::cout,"value at ");
          poVar2 = (ostream *)std::ostream::operator<<(poVar2,(int)lVar6);
          poVar2 = std::operator<<(poVar2,", ");
          poVar2 = (ostream *)std::ostream::operator<<(poVar2,(int)lVar5);
          poVar2 = std::operator<<(poVar2,", sample ");
          poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
          poVar2 = std::operator<<(poVar2,": ");
          poVar2 = (ostream *)
                   std::ostream::operator<<(poVar2,ph->_data[ph->_sizeY * lVar5 + lVar6][lVar4]);
          poVar2 = std::operator<<(poVar2,", should be ");
          poVar2 = (ostream *)std::ostream::operator<<(poVar2,iVar3);
          std::endl<char,std::char_traits<char>>(poVar2);
          std::ostream::flush();
          goto LAB_00160182;
        }
      }
    }
    lVar5 = lVar5 + 1;
  } while( true );
}

Assistant:

bool
checkPixels (Array2D<unsigned int>& sampleCount,
             Array2D<T*> &ph,
             int lx, int rx, int ly, int ry, int width)
{
    for (int y = ly; y <= ry; ++y)
    {
        for (int x = lx; x <= rx; ++x)
        {
            for (unsigned int i = 0; i < sampleCount[y][x]; i++)
            {
                if (ph[y][x][i] != static_cast<T>(((y * width + x) % 2049)))
                {
                    cout << "value at " << x << ", " << y << ", sample " << i << ": " << ph[y][x][i]
                         << ", should be " << (y * width + x) % 2049 << endl << flush;
                    return false;
                }
            }
        }
    }

    return true;
}